

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Example.cpp
# Opt level: O1

void __thiscall Nova::Example<float,_1>::Parse(Example<float,_1> *this,int argc,char **argv)

{
  Parse_Args *this_00;
  ostream *poVar1;
  char **in_RCX;
  string print_args;
  string local_40;
  
  this_00 = (Parse_Args *)operator_new(0x98);
  Parse_Args::Parse_Args(this_00);
  this->parse_args = this_00;
  (*this->_vptr_Example[5])(this);
  Parse_Args::Parse(this->parse_args,argc,argv);
  Parse_Args::Print_Arguments_abi_cxx11_(&local_40,(Parse_Args *)(ulong)(uint)argc,(int)argv,in_RCX)
  ;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->output,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  (*this->_vptr_Example[6])(this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Example<T,d>::
Parse(int argc,char* argv[])
{
    parse_args=new Parse_Args;
    Register_Options();

    parse_args->Parse(argc,argv);
    std::string print_args=parse_args->Print_Arguments(argc,argv);
    *output<<print_args<<std::endl;

    Parse_Options();
}